

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagShortPerSample
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint16_t value)

{
  uint16_t *value_00;
  ushort local_42;
  int o;
  uint16_t nb;
  uint16_t *na;
  uint16_t *m;
  uint16_t value_local;
  uint16_t tag_local;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    tif_local._4_4_ = 1;
  }
  else {
    value_00 = (uint16_t *)_TIFFmallocExt(tif,(ulong)(tif->tif_dir).td_samplesperpixel << 1);
    if (value_00 == (uint16_t *)0x0) {
      TIFFErrorExtR(tif,"TIFFWriteDirectoryTagShortPerSample","Out of memory");
      tif_local._4_4_ = 0;
    }
    else {
      _o = value_00;
      for (local_42 = 0; local_42 < (tif->tif_dir).td_samplesperpixel; local_42 = local_42 + 1) {
        *_o = value;
        _o = _o + 1;
      }
      tif_local._4_4_ =
           TIFFWriteDirectoryTagCheckedShortArray
                     (tif,ndir,dir,tag,(uint)(tif->tif_dir).td_samplesperpixel,value_00);
      _TIFFfreeExt(tif,value_00);
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagShortPerSample(TIFF *tif, uint32_t *ndir,
                                               TIFFDirEntry *dir, uint16_t tag,
                                               uint16_t value)
{
    static const char module[] = "TIFFWriteDirectoryTagShortPerSample";
    uint16_t *m;
    uint16_t *na;
    uint16_t nb;
    int o;
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    m = _TIFFmallocExt(tif, tif->tif_dir.td_samplesperpixel * sizeof(uint16_t));
    if (m == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }
    for (na = m, nb = 0; nb < tif->tif_dir.td_samplesperpixel; na++, nb++)
        *na = value;
    o = TIFFWriteDirectoryTagCheckedShortArray(
        tif, ndir, dir, tag, tif->tif_dir.td_samplesperpixel, m);
    _TIFFfreeExt(tif, m);
    return (o);
}